

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xmlXPathCompareNodeSets
              (xmlXPathParserContextPtr ctxt,int inf,int strict,xmlXPathObjectPtr arg1,
              xmlXPathObjectPtr arg2)

{
  double *pdVar1;
  xmlNodeSetPtr pxVar2;
  xmlNodeSetPtr pxVar3;
  bool bVar4;
  int iVar5;
  void *pvVar6;
  double val;
  double dVar7;
  xmlNodeSetPtr ns2;
  xmlNodeSetPtr ns1;
  int ret;
  double *values2;
  double val1;
  int local_38;
  int init;
  int j;
  int i;
  xmlXPathObjectPtr arg2_local;
  xmlXPathObjectPtr arg1_local;
  int strict_local;
  int inf_local;
  xmlXPathParserContextPtr ctxt_local;
  
  bVar4 = false;
  ns1._4_4_ = 0;
  if ((arg1 == (xmlXPathObjectPtr)0x0) ||
     ((arg1->type != XPATH_NODESET && (arg1->type != XPATH_XSLT_TREE)))) {
    xmlXPathFreeObject(arg2);
    ctxt_local._4_4_ = 0;
  }
  else if ((arg2 == (xmlXPathObjectPtr)0x0) ||
          ((arg2->type != XPATH_NODESET && (arg2->type != XPATH_XSLT_TREE)))) {
    xmlXPathFreeObject(arg1);
    xmlXPathFreeObject(arg2);
    ctxt_local._4_4_ = 0;
  }
  else {
    pxVar2 = arg1->nodesetval;
    pxVar3 = arg2->nodesetval;
    if ((pxVar2 == (xmlNodeSetPtr)0x0) || (pxVar2->nodeNr < 1)) {
      xmlXPathFreeObject(arg1);
      xmlXPathFreeObject(arg2);
      ctxt_local._4_4_ = 0;
    }
    else if ((pxVar3 == (xmlNodeSetPtr)0x0) || (pxVar3->nodeNr < 1)) {
      xmlXPathFreeObject(arg1);
      xmlXPathFreeObject(arg2);
      ctxt_local._4_4_ = 0;
    }
    else {
      pvVar6 = (*xmlMalloc)((long)pxVar3->nodeNr << 3);
      if (pvVar6 == (void *)0x0) {
        xmlXPathPErrMemory(ctxt);
        xmlXPathFreeObject(arg1);
        xmlXPathFreeObject(arg2);
        ctxt_local._4_4_ = 0;
      }
      else {
        for (init = 0; init < pxVar2->nodeNr; init = init + 1) {
          val = xmlXPathNodeToNumberInternal(ctxt,pxVar2->nodeTab[init]);
          iVar5 = xmlXPathIsNaN(val);
          if (iVar5 == 0) {
            for (local_38 = 0; local_38 < pxVar3->nodeNr; local_38 = local_38 + 1) {
              if (!bVar4) {
                dVar7 = xmlXPathNodeToNumberInternal(ctxt,pxVar3->nodeTab[local_38]);
                *(double *)((long)pvVar6 + (long)local_38 * 8) = dVar7;
              }
              iVar5 = xmlXPathIsNaN(*(double *)((long)pvVar6 + (long)local_38 * 8));
              if (iVar5 == 0) {
                if ((inf == 0) || (strict == 0)) {
                  if ((inf == 0) || (strict != 0)) {
                    if ((inf == 0) && (strict != 0)) {
                      pdVar1 = (double *)((long)pvVar6 + (long)local_38 * 8);
                      ns1._4_4_ = (uint)(*pdVar1 <= val && val != *pdVar1);
                    }
                    else if ((inf == 0) && (strict == 0)) {
                      ns1._4_4_ = (uint)(*(double *)((long)pvVar6 + (long)local_38 * 8) <= val);
                    }
                  }
                  else {
                    ns1._4_4_ = (uint)(val <= *(double *)((long)pvVar6 + (long)local_38 * 8));
                  }
                }
                else {
                  ns1._4_4_ = (uint)(val < *(double *)((long)pvVar6 + (long)local_38 * 8));
                }
                if (ns1._4_4_ != 0) break;
              }
            }
            if (ns1._4_4_ != 0) break;
            bVar4 = true;
          }
        }
        (*xmlFree)(pvVar6);
        xmlXPathFreeObject(arg1);
        xmlXPathFreeObject(arg2);
        ctxt_local._4_4_ = ns1._4_4_;
      }
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlXPathCompareNodeSets(xmlXPathParserContextPtr ctxt, int inf, int strict,
	                xmlXPathObjectPtr arg1, xmlXPathObjectPtr arg2) {
    int i, j, init = 0;
    double val1;
    double *values2;
    int ret = 0;
    xmlNodeSetPtr ns1;
    xmlNodeSetPtr ns2;

    if ((arg1 == NULL) ||
	((arg1->type != XPATH_NODESET) && (arg1->type != XPATH_XSLT_TREE))) {
	xmlXPathFreeObject(arg2);
        return(0);
    }
    if ((arg2 == NULL) ||
	((arg2->type != XPATH_NODESET) && (arg2->type != XPATH_XSLT_TREE))) {
	xmlXPathFreeObject(arg1);
	xmlXPathFreeObject(arg2);
        return(0);
    }

    ns1 = arg1->nodesetval;
    ns2 = arg2->nodesetval;

    if ((ns1 == NULL) || (ns1->nodeNr <= 0)) {
	xmlXPathFreeObject(arg1);
	xmlXPathFreeObject(arg2);
	return(0);
    }
    if ((ns2 == NULL) || (ns2->nodeNr <= 0)) {
	xmlXPathFreeObject(arg1);
	xmlXPathFreeObject(arg2);
	return(0);
    }

    values2 = (double *) xmlMalloc(ns2->nodeNr * sizeof(double));
    if (values2 == NULL) {
        xmlXPathPErrMemory(ctxt);
	xmlXPathFreeObject(arg1);
	xmlXPathFreeObject(arg2);
	return(0);
    }
    for (i = 0;i < ns1->nodeNr;i++) {
	val1 = xmlXPathNodeToNumberInternal(ctxt, ns1->nodeTab[i]);
	if (xmlXPathIsNaN(val1))
	    continue;
	for (j = 0;j < ns2->nodeNr;j++) {
	    if (init == 0) {
		values2[j] = xmlXPathNodeToNumberInternal(ctxt,
                                                          ns2->nodeTab[j]);
	    }
	    if (xmlXPathIsNaN(values2[j]))
		continue;
	    if (inf && strict)
		ret = (val1 < values2[j]);
	    else if (inf && !strict)
		ret = (val1 <= values2[j]);
	    else if (!inf && strict)
		ret = (val1 > values2[j]);
	    else if (!inf && !strict)
		ret = (val1 >= values2[j]);
	    if (ret)
		break;
	}
	if (ret)
	    break;
	init = 1;
    }
    xmlFree(values2);
    xmlXPathFreeObject(arg1);
    xmlXPathFreeObject(arg2);
    return(ret);
}